

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O2

bool __thiscall option::PrintUsageImplementation::LinePartIterator::next(LinePartIterator *this)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  
  if (this->ptr == (char *)0x0) {
    return false;
  }
  iVar4 = this->col;
  if (iVar4 == -1) {
    this->col = 0;
    update_length(this);
  }
  else {
    pcVar3 = this->ptr + this->len;
    this->ptr = pcVar3;
    bVar7 = this->hit_target_line;
    iVar5 = this->target_line_in_block;
    iVar2 = this->max_line_in_block;
    iVar6 = this->line_in_block;
    do {
      while ((cVar1 = *pcVar3, cVar1 == '\0' || (cVar1 == '\n'))) {
        if ((bVar7 & 1) == 0) goto LAB_0010d8b9;
        this->target_line_in_block = iVar5 + 1;
        if (iVar2 <= iVar5) {
          update_length(this);
          return false;
        }
        this->hit_target_line = false;
        this->line_in_block = 0;
        this->col = 0;
        iVar6 = 0;
        bVar7 = 0;
        iVar4 = 0;
        pcVar3 = this->rowstart;
        iVar5 = iVar5 + 1;
LAB_0010d874:
        this->ptr = pcVar3;
      }
      if (cVar1 == '\t') {
        if ((bVar7 & 1) == 0) break;
        this->hit_target_line = false;
        this->line_in_block = 0;
        iVar4 = iVar4 + 1;
        this->col = iVar4;
        iVar6 = 0;
        bVar7 = 0;
      }
      else {
        if (cVar1 != '\v') {
          pcVar3 = pcVar3 + 1;
          goto LAB_0010d874;
        }
        iVar6 = iVar6 + 1;
        this->line_in_block = iVar6;
        if (iVar2 <= iVar6) {
          iVar2 = iVar6;
        }
        this->max_line_in_block = iVar2;
      }
      pcVar3 = pcVar3 + 1;
      this->ptr = pcVar3;
    } while (iVar6 != iVar5);
LAB_0010d8b9:
    update_length(this);
    this->hit_target_line = true;
  }
  return true;
}

Assistant:

bool next()
    {
      if (ptr == 0)
        return false;

      if (col == -1)
      {
        col = 0;
        update_length();
        return true;
      }

      ptr += len;
      while (true)
      {
        switch (*ptr)
        {
          case '\v':
            upmax(max_line_in_block, ++line_in_block);
            ++ptr;
            break;
          case '\t':
            if (!hit_target_line) // if previous column did not have the targetline
            { // then "insert" a 0-length part
              update_length();
              hit_target_line = true;
              return true;
            }

            hit_target_line = false;
            line_in_block = 0;
            ++col;
            ++ptr;
            break;
          case 0:
          case '\n':
            if (!hit_target_line) // if previous column did not have the targetline
            { // then "insert" a 0-length part
              update_length();
              hit_target_line = true;
              return true;
            }

            if (++target_line_in_block > max_line_in_block)
            {
              update_length();
              return false;
            }

            hit_target_line = false;
            line_in_block = 0;
            col = 0;
            ptr = rowstart;
            continue;
          default:
            ++ptr;
            continue;
        } // switch

        if (line_in_block == target_line_in_block)
        {
          update_length();
          hit_target_line = true;
          return true;
        }
      } // while
    }